

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

void BenchElastic<4u>(string *PATH)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  void *pvVar6;
  ofstream *poVar7;
  reference ppbVar8;
  mapped_type *pmVar9;
  size_type sVar10;
  reference pvVar11;
  reference pvVar12;
  ostream *poVar13;
  pointer ppVar14;
  reference ppbVar15;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar17 [64];
  __type _Var16;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 extraout_var_02 [56];
  undefined1 auVar19 [64];
  undefined1 extraout_var_04 [56];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 extraout_var_06 [56];
  undefined1 auVar22 [64];
  undefined1 extraout_var_08 [56];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  basic_ostream<char,_std::char_traits<char>_> **out_2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range3_1;
  uint32_t topK;
  int j_1;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  iterator __end3;
  iterator __begin3;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range3;
  bool is_hit;
  int j;
  pair<unsigned_int,_Data<4U>_> p;
  int l;
  multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
  topk_items;
  HashMap<4U> mp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> total;
  queue<bool,_std::deque<bool,_std::allocator<bool>_>_> hits [1];
  basic_ostream<char,_std::char_traits<char>_> **out;
  iterator __end1;
  iterator __begin1;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range1;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  outs;
  WavingSketch<8U,_1U,_4U> *sketches [1];
  int32_t cmp_num;
  int nshrink;
  int output_pointer;
  int32_t K;
  int32_t checkpoint;
  double hit_lower_bound;
  double hit_upper_bound;
  int32_t memory_lower_bound;
  int32_t memory_upper_bound;
  string file;
  Data<4U> *items;
  count_type cnt;
  key_type *in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8f0;
  int in_stack_fffffffffffff8f4;
  const_iterator in_stack_fffffffffffff8f8;
  allocator_type *in_stack_fffffffffffff900;
  pointer *this;
  size_type in_stack_fffffffffffff908;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *pvVar27;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *in_stack_fffffffffffff910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff918;
  undefined8 in_stack_fffffffffffff928;
  WavingSketch<8U,_1U,_4U> *in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff940;
  uint32_t in_stack_fffffffffffff944;
  WavingSketch<8U,_1U,_4U> *in_stack_fffffffffffff970;
  ostream *in_stack_fffffffffffff998;
  ostream *in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a8;
  uint32_t in_stack_fffffffffffff9ac;
  WavingSketch<8U,_1U,_4U> *in_stack_fffffffffffff9b0;
  pointer *local_528;
  __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
  local_4a0;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *local_498;
  _Base_ptr local_490;
  uint local_488;
  int local_484;
  reference local_480;
  basic_ostream<char,_std::char_traits<char>_> **local_478;
  __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
  local_470;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *local_468;
  byte local_45d;
  int local_45c;
  _Base_ptr local_458;
  _Base_ptr local_450;
  _Base_ptr local_448;
  pair<int,_Data<4U>_> local_440;
  _Self local_438;
  _Self local_430;
  pair<int,_Data<4U>_> local_424;
  pair<unsigned_int,_Data<4U>_> local_41c;
  int local_414;
  undefined4 local_3a4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3a0;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  local_388 [3];
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  local_338;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *local_320;
  undefined1 local_311;
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [39];
  undefined1 local_2a9;
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [39];
  undefined1 local_241;
  string local_240 [32];
  string local_220 [32];
  string local_200 [39];
  undefined1 local_1d9;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [39];
  undefined1 local_171;
  string local_170 [32];
  string local_150 [32];
  string local_130 [39];
  undefined1 local_109;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [40];
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  local_a0;
  void *local_88;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 local_60;
  undefined4 local_54;
  undefined4 local_50;
  allocator local_39;
  string local_38 [32];
  Data<4U> *local_18;
  int local_c;
  undefined1 auVar18 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_07 [56];
  
  uVar5 = (uint32_t)((ulong)in_stack_fffffffffffff928 >> 0x20);
  printf("\x1b[0m\x1b[1;4;33m# Testing function: BenchElastic\n\x1b[0m");
  local_c = 0;
  local_18 = (Data<4U> *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"caida",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::c_str();
  local_18 = read_standard_data<4u>
                       ((char *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac,
                        (int *)in_stack_fffffffffffff9a0);
  local_50 = 0x108000;
  local_54 = 0x8400;
  local_60 = 0x3fe89374bc6a7efa;
  local_68 = 0x3fe76c8b43958106;
  local_6c = (int)((double)local_c * 0.005);
  local_70 = 1000;
  local_74 = 0;
  local_78 = 5;
  local_7c = 1;
  pvVar6 = operator_new(0xa8);
  WavingSketch<8U,_1U,_4U>::WavingSketch(in_stack_fffffffffffff930,uVar5);
  local_88 = pvVar6;
  std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>::allocator
            ((allocator<std::basic_ostream<char,_std::char_traits<char>_>_*> *)0x10da0c);
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::vector(in_stack_fffffffffffff910,in_stack_fffffffffffff908,in_stack_fffffffffffff900);
  std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>::~allocator
            ((allocator<std::basic_ostream<char,_std::char_traits<char>_>_*> *)0x10da35);
  poVar7 = (ofstream *)operator_new(0x200);
  local_109 = 1;
  std::operator+(in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8f8._M_node,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8f8._M_node,
                 (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::ofstream::ofstream(poVar7,local_c8,0x10);
  local_109 = 0;
  ppbVar8 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](&local_a0,0);
  *ppbVar8 = (value_type)poVar7;
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  poVar7 = (ofstream *)operator_new(0x200);
  local_171 = 1;
  std::operator+(in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8f8._M_node,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8f8._M_node,
                 (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::ofstream::ofstream(poVar7,local_130,0x10);
  local_171 = 0;
  ppbVar8 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](&local_a0,1);
  *ppbVar8 = (value_type)poVar7;
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_170);
  poVar7 = (ofstream *)operator_new(0x200);
  local_1d9 = 1;
  std::operator+(in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8f8._M_node,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8f8._M_node,
                 (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::ofstream::ofstream(poVar7,local_198,0x10);
  local_1d9 = 0;
  ppbVar8 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](&local_a0,2);
  *ppbVar8 = (value_type)poVar7;
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_1d8);
  poVar7 = (ofstream *)operator_new(0x200);
  local_241 = 1;
  std::operator+(in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8f8._M_node,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8f8._M_node,
                 (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::ofstream::ofstream(poVar7,local_200,0x10);
  local_241 = 0;
  ppbVar8 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](&local_a0,3);
  *ppbVar8 = (value_type)poVar7;
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_240);
  poVar7 = (ofstream *)operator_new(0x200);
  local_2a9 = 1;
  std::operator+(in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8f8._M_node,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8f8._M_node,
                 (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::ofstream::ofstream(poVar7,local_268,0x10);
  local_2a9 = 0;
  ppbVar8 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](&local_a0,4);
  *ppbVar8 = (value_type)poVar7;
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::~string(local_2a8);
  poVar7 = (ofstream *)operator_new(0x200);
  local_311 = 1;
  std::operator+(in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8f8._M_node,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8f8._M_node,
                 (char *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
  std::ofstream::ofstream(poVar7,local_2d0,0x10);
  local_311 = 0;
  ppbVar8 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](&local_a0,5);
  *ppbVar8 = (value_type)poVar7;
  std::__cxx11::string::~string(local_2d0);
  std::__cxx11::string::~string(local_2f0);
  std::__cxx11::string::~string(local_310);
  local_320 = &local_a0;
  local_338.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                         *)in_stack_fffffffffffff8e8);
  local_338.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                       *)in_stack_fffffffffffff8e8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                            (__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                             *)in_stack_fffffffffffff8e8), bVar2) {
    local_338.
    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         __gnu_cxx::
         __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
         ::operator*((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                      *)&local_338.
                         super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar13 = std::operator<<((ostream *)
                              *local_338.
                               super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,"MEM(KB)");
    poVar13 = std::operator<<(poVar13,",");
    poVar13 = std::operator<<(poVar13,(string *)((long)local_88 + 8));
    std::operator<<(poVar13,",");
    std::ostream::operator<<
              ((ostream *)
               *local_338.
                super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
    ::operator++((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                  *)&local_338.
                     super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  local_528 = (pointer *)local_388;
  do {
    std::queue<bool,std::deque<bool,std::allocator<bool>>>::
    queue<std::deque<bool,std::allocator<bool>>,void>
              ((queue<bool,_std::deque<bool,_std::allocator<bool>_>_> *)
               CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    local_528 = local_528 + 10;
  } while ((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            *)local_528 != &local_338);
  local_3a4 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x10e562);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff910,
             in_stack_fffffffffffff908,(value_type_conflict *)in_stack_fffffffffffff900,
             (allocator_type *)in_stack_fffffffffffff8f8._M_node);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x10e593);
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                   *)0x10e5a0);
  std::
  multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
  ::multiset((multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
              *)0x10e5ad);
  for (local_414 = 0; local_414 < local_c; local_414 = local_414 + 1) {
    std::
    unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
    ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                  *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                 (key_type *)in_stack_fffffffffffff8e8);
    local_424 = std::make_pair<int&,Data<4u>&>
                          ((int *)in_stack_fffffffffffff8e8,(Data<4U> *)0x10e618);
    std::pair<unsigned_int,_Data<4U>_>::pair<int,_Data<4U>,_true>(&local_41c,&local_424);
    local_430._M_node =
         (_Base_ptr)
         std::
         multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
         ::find(in_stack_fffffffffffff8f8._M_node,
                (key_type *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
    local_438._M_node =
         (_Base_ptr)
         std::
         multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
         ::end((multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
                *)in_stack_fffffffffffff8e8);
    bVar2 = std::operator!=(&local_430,&local_438);
    if (bVar2) {
      std::
      multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
      ::erase((multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
              in_stack_fffffffffffff8e8);
    }
    pmVar9 = std::
             unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                           *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                          (key_type *)in_stack_fffffffffffff8e8);
    *pmVar9 = *pmVar9 + 1;
    std::
    unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
    ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                  *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                 (key_type *)in_stack_fffffffffffff8e8);
    local_440 = std::make_pair<int&,Data<4u>&>
                          ((int *)in_stack_fffffffffffff8e8,(Data<4U> *)0x10e81c);
    std::pair<unsigned_int,Data<4u>>::operator=
              ((pair<unsigned_int,_Data<4U>_> *)
               CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
               (pair<int,_Data<4U>_> *)in_stack_fffffffffffff8e8);
    local_448 = (_Base_ptr)
                std::
                multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
                ::insert(in_stack_fffffffffffff8f8._M_node,
                         (value_type *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0)
                        );
    sVar10 = std::
             multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
             ::size((multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
                     *)0x10e889);
    if (1000 < sVar10) {
      local_450 = (_Base_ptr)
                  std::
                  multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
                  ::begin((multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
                           *)in_stack_fffffffffffff8e8);
      local_458 = (_Base_ptr)
                  std::
                  multiset<std::pair<unsigned_int,Data<4u>>,std::less<std::pair<unsigned_int,Data<4u>>>,std::allocator<std::pair<unsigned_int,Data<4u>>>>
                  ::erase_abi_cxx11_((multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
                                      *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0
                                                ),in_stack_fffffffffffff8f8);
    }
    for (local_45c = 0; local_45c < 1; local_45c = local_45c + 1) {
      iVar3 = (**(code **)(*(&local_88)[local_45c] + 0x18))
                        ((&local_88)[local_45c],local_18 + local_414);
      local_45d = iVar3 != 0;
      std::queue<bool,_std::deque<bool,_std::allocator<bool>_>_>::push
                ((queue<bool,_std::deque<bool,_std::allocator<bool>_>_> *)
                 CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                 (value_type *)in_stack_fffffffffffff8e8);
      uVar4 = (uint)local_45d;
      pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (&local_3a0,(long)local_45c);
      *pvVar11 = *pvVar11 + (uVar4 & 1);
      (*(code *)**(&local_88)[local_45c])((&local_88)[local_45c],local_18 + local_414);
      if (local_6c <= local_414) {
        pvVar12 = std::queue<bool,_std::deque<bool,_std::allocator<bool>_>_>::front
                            ((queue<bool,_std::deque<bool,_std::allocator<bool>_>_> *)0x10e9f3);
        vVar1 = *pvVar12;
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&local_3a0,(long)local_45c);
        *pvVar11 = *pvVar11 - (vVar1 & 1);
        std::queue<bool,_std::deque<bool,_std::allocator<bool>_>_>::pop
                  ((queue<bool,_std::deque<bool,_std::allocator<bool>_>_> *)0x10ea51);
      }
    }
    if ((local_414 % local_6c == 0) && (local_414 != 0)) {
      poVar13 = std::operator<<((ostream *)&std::cout,"checkpoint= ");
      poVar13 = (ostream *)
                std::ostream::operator<<(poVar13,((double)local_414 / (double)local_c) * 100.0);
      poVar13 = std::operator<<(poVar13," %");
      auVar20._0_8_ = std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
      auVar20._8_56_ = extraout_var;
      local_468 = &local_a0;
      local_470._M_current =
           (basic_ostream<char,_std::char_traits<char>_> **)
           std::
           vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                    *)in_stack_fffffffffffff8e8);
      local_478 = (basic_ostream<char,_std::char_traits<char>_> **)
                  std::
                  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                         *)in_stack_fffffffffffff8e8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                                (__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                                 *)in_stack_fffffffffffff8e8), bVar2) {
        local_480 = __gnu_cxx::
                    __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                    ::operator*(&local_470);
        poVar13 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)*local_480,(double)local_414 / (double)local_c);
        auVar20._8_56_ = extraout_var_00;
        auVar20._0_8_ = extraout_XMM0_Qa;
        std::operator<<(poVar13,",");
        __gnu_cxx::
        __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
        ::operator++(&local_470);
      }
      for (local_484 = 0; auVar23 = auVar20._0_16_, local_484 < 1; local_484 = local_484 + 1) {
        local_490 = (_Base_ptr)
                    std::
                    multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
                    ::begin((multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
                             *)in_stack_fffffffffffff8e8);
        ppVar14 = std::_Rb_tree_const_iterator<std::pair<unsigned_int,_Data<4U>_>_>::operator->
                            ((_Rb_tree_const_iterator<std::pair<unsigned_int,_Data<4U>_>_> *)
                             0x10ec1c);
        local_488 = ppVar14->first;
        WavingSketch<8U,_1U,_4U>::Check
                  (in_stack_fffffffffffff9b0,
                   (HashMap<4U> *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                   (count_type)((ulong)in_stack_fffffffffffff9a0 >> 0x20),
                   (vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                    *)in_stack_fffffffffffff998);
        ppbVar8 = std::
                  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  ::operator[](&local_a0,4);
        poVar13 = (ostream *)*ppbVar8;
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&local_3a0,(long)local_484);
        auVar23 = vcvtusi2sd_avx512f(auVar23,*pvVar11);
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,auVar23._0_8_ / (double)local_6c);
        std::operator<<(poVar13,",");
        ppbVar8 = std::
                  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  ::operator[](&local_a0,5);
        poVar13 = (ostream *)*ppbVar8;
        WavingSketch<8U,_1U,_4U>::getMemSize((WavingSketch<8U,_1U,_4U> *)(&local_88)[local_484]);
        auVar17._0_8_ = std::log2<unsigned_int>(0);
        auVar17._8_56_ = extraout_var_01;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = auVar17._0_8_;
        vroundsd_avx(auVar17._0_16_,auVar23,9);
        _Var16 = std::pow<int,double>(in_stack_fffffffffffff8f4,(double)in_stack_fffffffffffff8e8);
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,_Var16 * 1000.0);
        auVar18._8_56_ = extraout_var_02;
        auVar18._0_8_ = extraout_XMM0_Qa_00;
        auVar23 = auVar18._0_16_;
        std::operator<<(poVar13,",");
        poVar13 = std::operator<<((ostream *)&std::cout,"Hit Rate: ");
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&local_3a0,(long)local_484);
        auVar23 = vcvtusi2sd_avx512f(auVar23,*pvVar11);
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,auVar23._0_8_ / (double)local_6c);
        poVar13 = std::operator<<(poVar13," Mem: ");
        WavingSketch<8U,_1U,_4U>::getMemSize((WavingSketch<8U,_1U,_4U> *)(&local_88)[local_484]);
        auVar19._0_8_ = std::log2<unsigned_int>(0);
        auVar19._8_56_ = extraout_var_03;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = auVar19._0_8_;
        vroundsd_avx(auVar19._0_16_,auVar24,9);
        _Var16 = std::pow<int,double>(in_stack_fffffffffffff8f4,(double)in_stack_fffffffffffff8e8);
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,_Var16);
        in_stack_fffffffffffff9b0 = (WavingSketch<8U,_1U,_4U> *)std::operator<<(poVar13," KB");
        auVar20._0_8_ =
             std::ostream::operator<<
                       ((ostream *)in_stack_fffffffffffff9b0,std::endl<char,std::char_traits<char>>)
        ;
        auVar20._8_56_ = extraout_var_04;
        in_stack_fffffffffffff9ac =
             WavingSketch<8U,_1U,_4U>::getMemSize
                       ((WavingSketch<8U,_1U,_4U> *)(&local_88)[local_484]);
        auVar23 = auVar20._0_16_;
        if (in_stack_fffffffffffff9ac < 0x108000) {
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&local_3a0,(long)local_484);
          auVar23 = vcvtusi2sd_avx512f(auVar23,*pvVar11);
          auVar20 = ZEXT864((ulong)((double)local_6c * 0.732));
          if (auVar23._0_8_ < (double)local_6c * 0.732) {
            WavingSketch<8U,_1U,_4U>::expand(in_stack_fffffffffffff970);
            in_stack_fffffffffffff9a0 = std::operator<<((ostream *)&std::cout,"ID=");
            in_stack_fffffffffffff998 =
                 (ostream *)std::ostream::operator<<(in_stack_fffffffffffff9a0,local_484);
            poVar13 = std::operator<<(in_stack_fffffffffffff998," expand to ");
            WavingSketch<8U,_1U,_4U>::getMemSize((WavingSketch<8U,_1U,_4U> *)(&local_88)[local_484])
            ;
            auVar21._0_8_ = std::log2<unsigned_int>(0);
            auVar21._8_56_ = extraout_var_05;
            auVar25._8_8_ = 0;
            auVar25._0_8_ = auVar21._0_8_;
            vroundsd_avx(auVar21._0_16_,auVar25,9);
            _Var16 = std::pow<int,double>
                               (in_stack_fffffffffffff8f4,(double)in_stack_fffffffffffff8e8);
            in_stack_fffffffffffff970 =
                 (WavingSketch<8U,_1U,_4U> *)std::ostream::operator<<(poVar13,_Var16);
            poVar13 = std::operator<<((ostream *)in_stack_fffffffffffff970,"KB");
            auVar20._0_8_ = std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>)
            ;
            auVar20._8_56_ = extraout_var_06;
          }
        }
        uVar5 = WavingSketch<8U,_1U,_4U>::getMemSize
                          ((WavingSketch<8U,_1U,_4U> *)(&local_88)[local_484]);
        auVar23 = auVar20._0_16_;
        if (0x8400 < uVar5) {
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&local_3a0,(long)local_484);
          auVar23 = vcvtusi2sd_avx512f(auVar23,*pvVar11);
          auVar20 = ZEXT1664(auVar23);
          if ((double)local_6c * 0.768 < auVar23._0_8_) {
            WavingSketch<8U,_1U,_4U>::shrink
                      ((WavingSketch<8U,_1U,_4U> *)
                       CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
            poVar13 = std::operator<<((ostream *)&std::cout,"ID=");
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_484);
            poVar13 = std::operator<<(poVar13," shrink to ");
            in_stack_fffffffffffff944 =
                 WavingSketch<8U,_1U,_4U>::getMemSize
                           ((WavingSketch<8U,_1U,_4U> *)(&local_88)[local_484]);
            auVar22._0_8_ = std::log2<unsigned_int>(0);
            auVar22._8_56_ = extraout_var_07;
            auVar26._8_8_ = 0;
            auVar26._0_8_ = auVar22._0_8_;
            vroundsd_avx(auVar22._0_16_,auVar26,9);
            _Var16 = std::pow<int,double>
                               (in_stack_fffffffffffff8f4,(double)in_stack_fffffffffffff8e8);
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,_Var16);
            poVar13 = std::operator<<(poVar13,"KB");
            auVar20._0_8_ = std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>)
            ;
            auVar20._8_56_ = extraout_var_08;
          }
        }
      }
      local_498 = &local_a0;
      local_4a0._M_current =
           (basic_ostream<char,_std::char_traits<char>_> **)
           std::
           vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                    *)in_stack_fffffffffffff8e8);
      std::
      vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
      ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             *)in_stack_fffffffffffff8e8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                                (__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                                 *)in_stack_fffffffffffff8e8), bVar2) {
        ppbVar15 = __gnu_cxx::
                   __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                   ::operator*(&local_4a0);
        std::ostream::operator<<((ostream *)*ppbVar15,std::endl<char,std::char_traits<char>>);
        __gnu_cxx::
        __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
        ::operator++(&local_4a0);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  if (local_18 != (Data<4U> *)0x0) {
    operator_delete(local_18,4);
  }
  std::
  multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
  ::~multiset((multiset<std::pair<unsigned_int,_Data<4U>_>,_std::less<std::pair<unsigned_int,_Data<4U>_>_>,_std::allocator<std::pair<unsigned_int,_Data<4U>_>_>_>
               *)0x10f2c6);
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::~unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                    *)0x10f2d3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff900);
  pvVar27 = local_388;
  this = (pointer *)&local_338;
  do {
    this = &(((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
               *)(this + -0xc))->
            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::queue<bool,_std::deque<bool,_std::allocator<bool>_>_>::~queue
              ((queue<bool,_std::deque<bool,_std::allocator<bool>_>_> *)0x10f309);
  } while ((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            *)this != pvVar27);
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::~vector((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             *)this);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void BenchElastic(std::string PATH) {
	printf("\033[0m\033[1;4;33m# Testing function: BenchElastic\n\033[0m");
	count_type cnt = 0;
	Data<DATA_LEN>* items = NULL;
	std::string file = "caida";

	items = read_standard_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);

	constexpr int32_t memory_upper_bound = 1081344;
	constexpr int32_t memory_lower_bound = 16896 * 2;
	constexpr double hit_upper_bound = 0.768;
	constexpr double hit_lower_bound = 0.732;
	int32_t checkpoint = 0.005 * cnt;
	constexpr int32_t K = 1000;
	int output_pointer = 0;
	// constexpr int32_t num_inc = 10;
	int nshrink = 5;
	// constexpr int32_t mem_var = 6;
	constexpr int32_t cmp_num = 1;

	WavingSketch<8, 1, DATA_LEN>* sketches[cmp_num];

	sketches[0] = new WavingSketch<8, 1, DATA_LEN>(memory_upper_bound / (8 * 8 + 1 * 2));

	std::vector<std::ostream*> outs(6);
	outs[0] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_ARE.csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_CR.csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_PR.csv");
	outs[3] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_F1.csv");
	outs[4] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_HR.csv");
	outs[5] = new std::ofstream(RESULT_FOLDER + "elasticExpand_" + file + "_MEM.csv");
	for (auto& out : outs)
	{
		*out << "MEM(KB)" << "," << sketches[0]->name << ",";
		*out << std::endl;
	}
	std::queue<bool> hits[cmp_num];
	std::vector<uint32_t> total(cmp_num, 0);
	HashMap<DATA_LEN> mp;
	std::multiset<std::pair<uint32_t, Data<DATA_LEN>>> topk_items;
	for (int l = 0; l < cnt; ++l) {
		std::pair<uint32_t, Data<DATA_LEN>> p = std::make_pair(mp[items[l]], items[l]);
		if (topk_items.find(p) != topk_items.end())
		{
			topk_items.erase(p);
		}
		mp[items[l]] += 1;
		p = std::make_pair(mp[items[l]], items[l]);
		topk_items.insert(p);
		if (topk_items.size() > K)
		{
			topk_items.erase(topk_items.begin());
		}
		for (int j = 0; j < cmp_num; ++j) {
			bool is_hit = sketches[j]->QueryTopK(items[l]) != 0;
			hits[j].push(is_hit);
			total[j] += is_hit;
			sketches[j]->Init(items[l]);
			if (l >= checkpoint)
			{
				total[j] -= hits[j].front();
				hits[j].pop();
			}
		}
		if (l % checkpoint == 0 && l)// checkpoint=1 when slide window
		{
			std::cout << "checkpoint= " << l * 1.0 / cnt * 100 << " %" << std::endl;
			for (auto& out : outs)
			{
				*out << l * 1.0 / cnt << ",";
			}
			for (int j = 0; j < cmp_num; j++)
			{
				uint32_t topK = topk_items.begin()->first;
				sketches[j]->Check(mp, topK, outs);
				*outs[4] << total[j] * 1.0 / checkpoint << ",";
				*outs[5] << pow(2, floor(log2(sketches[j]->getMemSize() / 1000))) * 1000 << ",";
				std::cout << "Hit Rate: " << total[j] * 1.0 / checkpoint
					<< " Mem: " << pow(2, floor(log2(sketches[j]->getMemSize() / 1000))) << " KB" << std::endl;

				if (sketches[j]->getMemSize() < memory_upper_bound
					&& total[j] < hit_lower_bound * checkpoint)
				{
					sketches[j]->expand();
					std::cout << "ID=" << j << " expand to " << pow(2, floor(log2(sketches[j]->getMemSize() / 1000))) << "KB" << std::endl;
				}
				if (sketches[j]->getMemSize() > memory_lower_bound
					&& total[j] > hit_upper_bound * checkpoint)
				{
					sketches[j]->shrink();
					std::cout << "ID=" << j << " shrink to " << pow(2, floor(log2(sketches[j]->getMemSize() / 1000))) << "KB" << std::endl;
				}
			}
			for (auto& out : outs)
			{
				*out << std::endl;
			}
			std::cout << std::endl;
		}
	}
	delete items;
}